

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O0

bool bssl::uses_disallowed_feature(SSL *ssl)

{
  bool bVar1;
  pointer pSVar2;
  pointer this;
  size_t sVar3;
  pointer psVar4;
  bool local_11;
  SSL *ssl_local;
  
  local_11 = true;
  if ((ssl->method->is_dtls & 1U) == 0) {
    pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    this = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&pSVar2->cert);
    bVar1 = Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_>::empty
                      (&this->credentials);
    local_11 = true;
    if (bVar1) {
      pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
      sVar3 = Array<unsigned_char>::size(&pSVar2->quic_transport_params);
      local_11 = true;
      if (sVar3 == 0) {
        psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl->ctx);
        local_11 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&psVar4->ech_keys);
      }
    }
  }
  return local_11;
}

Assistant:

static bool uses_disallowed_feature(const SSL *ssl) {
  return ssl->method->is_dtls || !ssl->config->cert->credentials.empty() ||
         ssl->config->quic_transport_params.size() > 0 || ssl->ctx->ech_keys;
}